

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O1

int http1_send_body(http_s *h,void *data,uintptr_t length)

{
  FIOBJ dest;
  int iVar1;
  
  dest = headers2str(h,length);
  if (dest == 0) {
    iVar1 = -1;
  }
  else {
    fiobj_str_write(dest,(char *)data,length);
    fiobj_send_free(*(intptr_t *)((h->private_data).flag + 0x30),dest);
    iVar1 = 0;
  }
  http1_after_finish(h);
  return iVar1;
}

Assistant:

static int http1_send_body(http_s *h, void *data, uintptr_t length) {

  FIOBJ packet = headers2str(h, length);
  if (!packet) {
    http1_after_finish(h);
    return -1;
  }
  fiobj_str_write(packet, data, length);
  fiobj_send_free((handle2pr(h)->p.uuid), packet);
  http1_after_finish(h);
  return 0;
}